

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tunings.h
# Opt level: O0

void __thiscall Tunings::TuningError::~TuningError(TuningError *this)

{
  TuningError *this_local;
  
  *(undefined ***)this = &PTR__TuningError_00109d90;
  std::__cxx11::string::~string((string *)&this->whatv);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

TuningError(std::string m) : whatv(m) {}